

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

void __thiscall libtorrent::dht::rpc_manager::~rpc_manager(rpc_manager *this)

{
  bool bVar1;
  reference ppVar2;
  element_type *this_00;
  pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_> *t;
  iterator __end2;
  iterator __begin2;
  unordered_multimap<unsigned_short,_std::shared_ptr<libtorrent::dht::observer>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>_>
  *__range2;
  rpc_manager *this_local;
  
  *(uint *)&this->field_0xb4 = *(uint *)&this->field_0xb4 & 0x7fffffff | 0x80000000;
  __end2 = ::std::
           unordered_multimap<unsigned_short,_std::shared_ptr<libtorrent::dht::observer>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>_>
           ::begin(&this->m_transactions);
  t = (pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_> *)
      ::std::
      unordered_multimap<unsigned_short,_std::shared_ptr<libtorrent::dht::observer>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>_>
      ::end(&this->m_transactions);
  while( true ) {
    bVar1 = ::std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false>
                         *)&t);
    if (!bVar1) break;
    ppVar2 = ::std::__detail::
             _Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
             ::operator*(&__end2);
    this_00 = ::std::
              __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar2->second);
    observer::abort(this_00);
    ::std::__detail::
    _Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
    ::operator++(&__end2);
  }
  libtorrent::aux::listen_socket_handle::~listen_socket_handle(&this->m_sock);
  ::std::
  unordered_multimap<unsigned_short,_std::shared_ptr<libtorrent::dht::observer>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>_>
  ::~unordered_multimap(&this->m_transactions);
  boost::pool<libtorrent::aux::allocator_new_delete>::~pool(&this->m_pool_allocator);
  return;
}

Assistant:

rpc_manager::~rpc_manager()
{
	TORRENT_ASSERT(!m_destructing);
	m_destructing = true;

	for (auto const& t : m_transactions)
		t.second->abort();
}